

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

String * __thiscall
capnp::compiler::CompilerMain::readOneJson
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  byte bVar1;
  byte bVar2;
  RemoveConst<char> *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  char *pcVar6;
  size_t __n;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  char cVar11;
  Vector<char> chars;
  Vector<char> local_68;
  BufferedInputStreamWrapper *local_40;
  String *local_38;
  byte *__src;
  
  local_68.builder.ptr = (char *)0x0;
  local_68.builder.pos = (char *)0x0;
  local_68.builder.endPtr = (char *)0x0;
  local_68.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  bVar2 = 0;
  iVar10 = 0;
  cVar11 = '\0';
  local_40 = input;
  local_38 = __return_storage_ptr__;
  do {
    iVar4 = (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])();
    __src = (byte *)CONCAT44(extraout_var,iVar4);
    if (__n == 0) {
      if (local_68.builder.pos == local_68.builder.endPtr) {
        sVar9 = 4;
        if (local_68.builder.pos != local_68.builder.ptr) {
          sVar9 = ((long)local_68.builder.pos - (long)local_68.builder.ptr) * 2;
        }
        kj::Vector<char>::setCapacity(&local_68,sVar9);
      }
      *local_68.builder.pos = '\0';
      local_68.builder.pos = local_68.builder.pos + 1;
      if (local_68.builder.pos != local_68.builder.endPtr) {
        kj::Vector<char>::setCapacity
                  (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
      }
LAB_001218c4:
      (local_38->content).ptr = local_68.builder.ptr;
      (local_38->content).size_ = (long)local_68.builder.pos - (long)local_68.builder.ptr;
      (local_38->content).disposer = local_68.builder.disposer;
      return local_38;
    }
    lVar7 = 0;
    pbVar5 = __src;
    do {
      bVar1 = *pbVar5;
      if (cVar11 == '\0') {
        if (bVar1 < 0x7b) {
          if (bVar1 == 0x23) {
LAB_001216ef:
            cVar11 = '\x02';
          }
          else if (bVar1 == 0x2f) {
            cVar11 = '\x01';
          }
        }
        else {
LAB_001216f7:
          if (bVar1 == 0x7b) {
            if ((bool)(iVar10 == 0 & bVar2)) {
              pcVar6 = local_68.builder.pos + (-lVar7 - (long)local_68.builder.ptr);
              if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar6) {
                pcVar8 = (char *)0x4;
                if (local_68.builder.endPtr != local_68.builder.ptr) {
                  pcVar8 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) *
                                   2);
                }
                if (pcVar8 < pcVar6) {
                  pcVar8 = pcVar6;
                }
                kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar8);
              }
              pRVar3 = local_68.builder.pos;
              if (lVar7 != 0) {
                memcpy(local_68.builder.pos,__src,-lVar7);
                local_68.builder.pos = pRVar3 + -lVar7;
              }
              if (local_68.builder.pos == local_68.builder.endPtr) {
                sVar9 = 4;
                if (local_68.builder.pos != local_68.builder.ptr) {
                  sVar9 = ((long)local_68.builder.pos - (long)local_68.builder.ptr) * 2;
                }
                kj::Vector<char>::setCapacity(&local_68,sVar9);
              }
              *local_68.builder.pos = '\0';
              local_68.builder.pos = local_68.builder.pos + 1;
              (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                        (local_40,-lVar7);
              if (local_68.builder.pos != local_68.builder.endPtr) {
                kj::Vector<char>::setCapacity
                          (&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
              }
              goto LAB_001218c4;
            }
            iVar10 = iVar10 + 1;
          }
          else if (bVar1 == 0x7d) {
            if (iVar10 == 0) {
              iVar10 = 0;
            }
            else {
              iVar10 = iVar10 + -1;
              bVar2 = bVar2 | iVar10 == 0;
            }
          }
        }
      }
      else if (cVar11 == '\x02') {
        cVar11 = (bVar1 != 10) * '\x02';
      }
      else {
        if (0x7a < bVar1) goto LAB_001216f7;
        if ((bVar1 == 0x23) || (bVar1 == 0x2f)) goto LAB_001216ef;
      }
      lVar7 = lVar7 + -1;
      pbVar5 = pbVar5 + 1;
    } while (__n + lVar7 != 0);
    pcVar6 = local_68.builder.pos + (__n - (long)local_68.builder.ptr);
    if (local_68.builder.endPtr + -(long)local_68.builder.ptr < pcVar6) {
      pcVar8 = (char *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
      if (local_68.builder.endPtr == local_68.builder.ptr) {
        pcVar8 = (char *)0x4;
      }
      if (pcVar8 < pcVar6) {
        pcVar8 = pcVar6;
      }
      kj::Vector<char>::setCapacity(&local_68,(size_t)pcVar8);
    }
    pRVar3 = local_68.builder.pos;
    memcpy(local_68.builder.pos,__src,__n);
    local_68.builder.pos = pRVar3 + __n;
    (*(local_40->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(local_40,__n);
  } while( true );
}

Assistant:

kj::String readOneJson(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one brace-delimited message from the input.
    //
    // Accounts for nested braces, string literals, and comments starting with # or //. Technically
    // JSON does not permit comments but this code is lenient in case we change things later.

    enum {
      NORMAL,
      SLASH,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case SLASH:
            if (c == '/') {
              state = COMMENT;
              break;
            }
            KJ_FALLTHROUGH;
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '/': state = SLASH; break;
              case '{':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case '}':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }